

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmargins.cpp
# Opt level: O2

QDataStream * operator<<(QDataStream *s,QMarginsF *m)

{
  QDataStream *pQVar1;
  
  pQVar1 = QDataStream::operator<<(s,m->m_left);
  pQVar1 = QDataStream::operator<<(pQVar1,m->m_top);
  pQVar1 = QDataStream::operator<<(pQVar1,m->m_right);
  QDataStream::operator<<(pQVar1,m->m_bottom);
  return s;
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QMarginsF &m)
{
    s << double(m.left()) << double(m.top()) << double(m.right()) << double(m.bottom());
    return s;
}